

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestRequiredMessage::_InternalSerialize
          (TestRequiredMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  TestRequired *pTVar2;
  ulong uVar3;
  anon_union_48_1_493b367e_for_TestRequiredMessage_3 aVar4;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestRequired>_> *value;
  uint8_t *puVar5;
  int index;
  
  aVar4 = this->field_0;
  if (((undefined1  [48])aVar4 & (undefined1  [48])0x1) != (undefined1  [48])0x0) {
    pTVar2 = (this->field_0)._impl_.optional_message_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,(MessageLite *)pTVar2,(pTVar2->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (index = 0; iVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestRequired>>
                      (&(this->field_0)._impl_.repeated_message_.super_RepeatedPtrFieldBase,index);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if (((undefined1  [48])aVar4 & (undefined1  [48])0x2) != (undefined1  [48])0x0) {
    pTVar2 = (this->field_0)._impl_.required_message_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (3,(MessageLite *)pTVar2,(pTVar2->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRequiredMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRequiredMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestRequiredMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.TestRequired optional_message = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.optional_message_, this_._impl_.optional_message_->GetCachedSize(), target,
        stream);
  }

  // repeated .proto2_unittest.TestRequired repeated_message = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_message_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_message().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // .proto2_unittest.TestRequired required_message = 3 [features = {
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.required_message_, this_._impl_.required_message_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestRequiredMessage)
  return target;
}